

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O3

void beltCHEStart(void *state,octet *key,size_t len,octet *iv)

{
  octet *src;
  
  beltKeyExpand2((u32 *)state,key,len);
  *(undefined8 *)((long)state + 0x30) = *(undefined8 *)iv;
  *(undefined8 *)((long)state + 0x38) = *(undefined8 *)(iv + 8);
  beltBlockEncr((octet *)((long)state + 0x30),(u32 *)state);
  u32From((u32 *)((long)state + 0x20),(octet *)((long)state + 0x30),0x10);
  src = beltH();
  u64From((u64 *)((long)state + 0x40),src,0x10);
  memSet((void *)((long)state + 0x60),'\0',0x10);
  *(undefined8 *)((long)state + 0x90) = 0;
  *(undefined8 *)((long)state + 0x98) = 0;
  return;
}

Assistant:

void beltCHEStart(void* state, const octet key[], size_t len, 
	const octet iv[16])
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsDisjoint2(iv, 16, state, beltCHE_keep()));
	// разобрать key и iv
	beltKeyExpand2(st->key, key, len);
	beltBlockCopy(st->r, iv);
	beltBlockEncr((octet*)st->r, st->key);
	u32From(st->s, st->r, 16);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevW(st->r);
#endif
	// подготовить t
	wwFrom(st->t, beltH(), 16);
	// обнулить счетчики
	memSetZero(st->len, sizeof(st->len));
	st->reserved = 0;
	st->filled = 0;
}